

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O2

void FAudio_OPERATIONSET_Execute(FAudio *audio)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  FAudio_OPERATIONSET_Operation *op;
  
  FAudio_PlatformLockMutex(audio->operationLock);
  op = audio->committedOperations;
  while (op != (FAudio_OPERATIONSET_Operation *)0x0) {
    pFVar1 = op->next;
    switch(op->Type) {
    case FAUDIOOP_ENABLEEFFECT:
      FAudioVoice_EnableEffect(op->Voice,(op->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_DISABLEEFFECT:
      FAudioVoice_DisableEffect(op->Voice,(op->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_SETEFFECTPARAMETERS:
      FAudioVoice_SetEffectParameters
                (op->Voice,(op->Data).SetEffectParameters.EffectIndex,
                 (op->Data).SetEffectParameters.pParameters,
                 (op->Data).SetEffectParameters.ParametersByteSize,0);
      break;
    case FAUDIOOP_SETFILTERPARAMETERS:
      FAudioVoice_SetFilterParameters
                (op->Voice,(FAudioFilterParameters *)&(op->Data).EnableEffect,0);
      break;
    case FAUDIOOP_SETOUTPUTFILTERPARAMETERS:
      FAudioVoice_SetOutputFilterParameters
                (op->Voice,(op->Data).SetOutputFilterParameters.pDestinationVoice,
                 (FAudioFilterParameters *)&(op->Data).SetFilterParameters.Parameters.OneOverQ,0);
      break;
    case FAUDIOOP_SETVOLUME:
      FAudioVoice_SetVolume(op->Voice,(float)(op->Data).EnableEffect.EffectIndex,0);
      break;
    case FAUDIOOP_SETCHANNELVOLUMES:
      FAudioVoice_SetChannelVolumes
                (op->Voice,(op->Data).SetEffectParameters.EffectIndex,
                 (op->Data).SetChannelVolumes.pVolumes,0);
      break;
    case FAUDIOOP_SETOUTPUTMATRIX:
      FAudioVoice_SetOutputMatrix
                (op->Voice,(op->Data).SetOutputFilterParameters.pDestinationVoice,
                 (op->Data).SetOutputMatrix.SourceChannels,
                 (op->Data).SetOutputMatrix.DestinationChannels,
                 (op->Data).SetOutputMatrix.pLevelMatrix,0);
      break;
    case FAUDIOOP_START:
      FAudioSourceVoice_Start(op->Voice,(op->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_STOP:
      FAudioSourceVoice_Stop(op->Voice,(op->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_EXITLOOP:
      FAudioSourceVoice_ExitLoop(op->Voice,0);
      break;
    case FAUDIOOP_SETFREQUENCYRATIO:
      FAudioSourceVoice_SetFrequencyRatio(op->Voice,(float)(op->Data).EnableEffect.EffectIndex,0);
    }
    DeleteOperation(op,audio->pFree);
    op = pFVar1;
  }
  audio->committedOperations = (FAudio_OPERATIONSET_Operation *)0x0;
  FAudio_PlatformUnlockMutex(audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_Execute(FAudio *audio)
{
	FAudio_OPERATIONSET_Operation *op, *next;

	FAudio_PlatformLockMutex(audio->operationLock);
	LOG_MUTEX_LOCK(audio, audio->operationLock)

	op = audio->committedOperations;
	while (op != NULL)
	{
		next = op->next;
		ExecuteOperation(op);
		DeleteOperation(op, audio->pFree);
		op = next;
	}
	audio->committedOperations = NULL;

	FAudio_PlatformUnlockMutex(audio->operationLock);
	LOG_MUTEX_UNLOCK(audio, audio->operationLock)
}